

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O2

void __thiscall
EnvironmentMap::create_descriptors(EnvironmentMap *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkDescriptorPoolSize> __l;
  undefined1 local_c0 [16];
  initializer_list<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_> local_b0;
  DescriptorPool local_a0;
  VkSampler immutable_samplers [1];
  DescriptorSet local_68;
  
  local_c0._0_4_ = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  local_c0._4_4_ = 2;
  __l._M_len = 1;
  __l._M_array = (iterator)local_c0;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_68,__l,
             (allocator_type *)(local_c0 + 0x10));
  myvk::DescriptorPool::Create
            ((DescriptorPool *)(local_c0 + 0x20),device,1,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_68);
  std::__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_pool).
              super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_a0.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>);
  std::_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~_Vector_base
            ((_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_68)
  ;
  immutable_samplers[0] =
       ((this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       m_sampler;
  local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)immutable_samplers;
  local_68.super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x100000000;
  local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x3000000001;
  local_68.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
  local_68.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  local_68.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x2000000001;
  local_b0._M_len = 2;
  local_b0._M_array = (iterator)&local_68;
  local_68.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
       _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_68.m_descriptor_set._0_4_ =
       local_68.m_descriptor_pool_ptr.
       super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
  myvk::DescriptorBindingFlagGroup::DescriptorBindingFlagGroup
            ((DescriptorBindingFlagGroup *)(local_c0 + 0x20),
             (initializer_list<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_> *)
             (local_c0 + 0x10));
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)local_c0,device,(DescriptorBindingFlagGroup *)(local_c0 + 0x20))
  ;
  std::__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_set_layout).
              super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  myvk::DescriptorBindingFlagGroup::~DescriptorBindingFlagGroup
            ((DescriptorBindingFlagGroup *)(local_c0 + 0x20));
  myvk::DescriptorSet::Create(&local_68,&this->m_descriptor_pool,&this->m_descriptor_set_layout);
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>);
  return;
}

Assistant:

void EnvironmentMap::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 2}});
	{
		VkSampler immutable_samplers[] = {m_sampler->GetHandle()};

		VkDescriptorSetLayoutBinding hdr_image_binding = {};
		hdr_image_binding.binding = 0;
		hdr_image_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		hdr_image_binding.descriptorCount = 1;
		hdr_image_binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT | VK_SHADER_STAGE_COMPUTE_BIT;
		hdr_image_binding.pImmutableSamplers = immutable_samplers;

		VkDescriptorSetLayoutBinding alias_table_image_binding = {};
		alias_table_image_binding.binding = 1;
		alias_table_image_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		alias_table_image_binding.descriptorCount = 1;
		alias_table_image_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT;
		alias_table_image_binding.pImmutableSamplers = immutable_samplers;

		m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(
		    device, {{hdr_image_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT},
		             {alias_table_image_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT}});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
}